

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> * __thiscall
solitaire::SolitaireTest::makeSharedPtrArray<solitaire::piles::FoundationPileMock,4ul>
          (SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> *__return_storage_ptr__,
          SolitaireTest *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FoundationPileMock *pFVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  SharedPtrArray<solitaire::piles::FoundationPileMock,_4UL> *__range2;
  long lVar4;
  undefined1 local_39;
  FoundationPileMock *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  __return_storage_ptr__->_M_elems[3].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[3].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[2].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[2].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[1].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[1].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __return_storage_ptr__->_M_elems[0].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  __return_storage_ptr__->_M_elems[0].
  super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar4 = 0;
  do {
    local_38 = (FoundationPileMock *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<solitaire::piles::FoundationPileMock,std::allocator<solitaire::piles::FoundationPileMock>>
              (&_Stack_30,&local_38,(allocator<solitaire::piles::FoundationPileMock> *)&local_39);
    _Var3._M_pi = _Stack_30._M_pi;
    pFVar2 = local_38;
    local_38 = (FoundationPileMock *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&__return_storage_ptr__->_M_elems[0].
                       super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + lVar4);
    puVar1 = (undefined8 *)
             ((long)&__return_storage_ptr__->_M_elems[0].
                     super___shared_ptr<solitaire::piles::FoundationPileMock,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + lVar4);
    *puVar1 = pFVar2;
    puVar1[1] = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

SharedPtrArray<T, N> makeSharedPtrArray() {
        SharedPtrArray<T, N> result;
        for (auto& ptr: result)
            ptr = std::make_shared<T>();
        return result;
    }